

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O1

void CSound::RateConvert(int SampleID)

{
  int iVar1;
  int iVar2;
  short *psVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  short *psVar7;
  ulong uVar8;
  CSample *pCVar9;
  
  if (m_aSamples[SampleID].m_pData != (short *)0x0) {
    pCVar9 = m_aSamples + SampleID;
    if (m_aSamples[SampleID].m_Rate != m_MixingRate) {
      uVar4 = (uint)((float)m_MixingRate *
                    ((float)m_aSamples[SampleID].m_NumFrames / (float)m_aSamples[SampleID].m_Rate));
      psVar3 = (short *)mem_alloc(m_aSamples[SampleID].m_Channels * uVar4 * 2);
      if (0 < (int)uVar4) {
        iVar1 = m_aSamples[SampleID].m_NumFrames;
        iVar2 = m_aSamples[SampleID].m_Channels;
        uVar5 = 0;
        do {
          iVar6 = (int)(((float)(int)uVar5 / (float)(int)uVar4) * (float)iVar1);
          if (iVar1 <= iVar6) {
            iVar6 = iVar1 + -1;
          }
          if (iVar2 == 2) {
            psVar7 = pCVar9->m_pData;
            psVar3[uVar5 * 2] = psVar7[iVar6 * 2];
            psVar7 = psVar7 + (iVar6 * 2 + 1);
            uVar8 = uVar5 * 2 + 1;
LAB_0012ff19:
            psVar3[uVar8] = *psVar7;
          }
          else if (iVar2 == 1) {
            psVar7 = pCVar9->m_pData + iVar6;
            uVar8 = uVar5;
            goto LAB_0012ff19;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      mem_free(pCVar9->m_pData);
      pCVar9->m_pData = psVar3;
      m_aSamples[SampleID].m_NumFrames = uVar4;
    }
  }
  return;
}

Assistant:

void CSound::RateConvert(int SampleID)
{
	CSample *pSample = &m_aSamples[SampleID];
	int NumFrames = 0;
	short *pNewData = 0;

	// make sure that we need to convert this sound
	if(!pSample->m_pData || pSample->m_Rate == m_MixingRate)
		return;

	// allocate new data
	NumFrames = (int)((pSample->m_NumFrames/(float)pSample->m_Rate)*m_MixingRate);
	pNewData = (short *)mem_alloc(NumFrames*pSample->m_Channels*sizeof(short));

	for(int i = 0; i < NumFrames; i++)
	{
		// resample TODO: this should be done better, like linear at least
		float a = i/(float)NumFrames;
		int f = (int)(a*pSample->m_NumFrames);
		if(f >= pSample->m_NumFrames)
			f = pSample->m_NumFrames-1;

		// set new data
		if(pSample->m_Channels == 1)
			pNewData[i] = pSample->m_pData[f];
		else if(pSample->m_Channels == 2)
		{
			pNewData[i*2] = pSample->m_pData[f*2];
			pNewData[i*2+1] = pSample->m_pData[f*2+1];
		}
	}

	// free old data and apply new
	mem_free(pSample->m_pData);
	pSample->m_pData = pNewData;
	pSample->m_NumFrames = NumFrames;
}